

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall google::protobuf::RepeatedField<bool>::~RepeatedField(RepeatedField<bool> *this)

{
  ulong uVar1;
  int iVar2;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 this_00;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *paVar3;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  if ((uVar1 & 4) == 0) {
    this_00.arena = protobuf::internal::SooRep::soo_arena(&this->soo_rep_);
  }
  else {
    paVar3 = &heap_rep(this)->field_0;
    this_00 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1)paVar3->arena;
  }
  if (this_00.arena != (Arena *)0x0) {
    protobuf::internal::ThreadSafeArena::SpaceAllocated(&(this_00.arena)->impl_);
  }
  iVar2 = protobuf::internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  if (((uVar1 & 4) != 0) && (0 < iVar2)) {
    protobuf::internal::LongSooRep::elements((LongSooRep *)this);
  }
  UnpoisonBuffer(this);
  if ((uVar1 & 4) != 0) {
    InternalDeallocate<true>(this);
  }
  return;
}

Assistant:

RepeatedField<Element>::~RepeatedField() {
  StaticValidityCheck();
  const bool is_soo = this->is_soo();
#ifndef NDEBUG
  // Try to trigger segfault / asan failure in non-opt builds if arena_
  // lifetime has ended before the destructor.
  auto arena = GetArena(is_soo);
  if (arena) (void)arena->SpaceAllocated();
#endif
  const int size = this->size(is_soo);
  if (size > 0) {
    Element* elem = unsafe_elements(is_soo);
    Destroy(elem, elem + size);
  }
  UnpoisonBuffer();
  if (!is_soo) InternalDeallocate<true>();
}